

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O0

bool __thiscall OB::Color::key(Color *this,string *k)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  undefined1 auVar10 [16];
  bool local_1e9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1c8;
  string local_1c0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1a0;
  HSL local_180;
  byte local_161;
  string local_160;
  byte local_139;
  string local_138;
  string local_118;
  byte local_f1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_f0;
  byte local_c9;
  double local_c8;
  double dStack_c0;
  double local_b8;
  string local_b0;
  byte local_79;
  double local_78;
  double dStack_70;
  double local_68;
  string local_58;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *k_local;
  Color *this_local;
  
  local_18 = k;
  k_local = (string *)this;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    bVar3 = std::operator==(local_18,"clear");
    if (bVar3) {
      std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
      std::__cxx11::string::operator=((string *)&this->_value,"");
      this->_valid = true;
    }
    else {
      bVar3 = std::operator==(local_18,"reverse");
      if (bVar3) {
        std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
        std::__cxx11::string::operator=((string *)&this->_value,"\x1b[7m");
        this->_valid = true;
      }
      else {
        bVar3 = std::operator==(local_18,"rainbow");
        if (((bVar3) || (bVar3 = std::operator==(local_18,"candy"), bVar3)) ||
           (bVar3 = std::operator==(local_18,"party"), bVar3)) {
          pcVar8 = (char *)std::__cxx11::string::at((ulong)local_18);
          cVar1 = *pcVar8;
          if (cVar1 == 'c') {
            this->_mode = candy;
          }
          else if (cVar1 == 'p') {
            this->_mode = party;
          }
          else if (cVar1 == 'r') {
            this->_mode = rainbow;
          }
          std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
          lVar7 = random(this);
          auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar10._0_8_ = lVar7;
          auVar10._12_4_ = 0x45300000;
          (this->_hsl).h =
               (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
          local_79 = 0;
          local_c9 = 0;
          if ((this->_fg & 1U) == 0) {
            local_b8 = (this->_hsl).l;
            local_c8 = (this->_hsl).h;
            dStack_c0 = (this->_hsl).s;
            hsl_to_hex_abi_cxx11_(&local_b0,this,this->_hsl);
            local_c9 = 1;
            Term::ANSI_Escape_Codes::bg_true(&local_38,&local_b0);
          }
          else {
            local_68 = (this->_hsl).l;
            local_78 = (this->_hsl).h;
            dStack_70 = (this->_hsl).s;
            hsl_to_hex_abi_cxx11_(&local_58,this,this->_hsl);
            local_79 = 1;
            Term::ANSI_Escape_Codes::fg_true(&local_38,&local_58);
          }
          std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if ((local_c9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_b0);
          }
          if ((local_79 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_58);
          }
          this->_valid = true;
        }
        else {
          pcVar8 = (char *)std::__cxx11::string::at((ulong)local_18);
          pbVar2 = local_18;
          local_f1 = 0;
          local_1e9 = false;
          if (*pcVar8 == '#') {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_f0,"^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$",0x10);
            local_f1 = 1;
            local_1e9 = String::assert_rx(pbVar2,&local_f0);
          }
          if ((local_f1 & 1) != 0) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_f0);
          }
          pbVar2 = local_18;
          if (local_1e9 == false) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_1a0,"^[0-9]{1,3}$",0x10);
            bVar4 = String::assert_rx(pbVar2,&local_1a0);
            bVar3 = false;
            if (bVar4) {
              iVar5 = std::__cxx11::stoi(local_18,(size_t *)0x0,10);
              bVar3 = false;
              if (-1 < iVar5) {
                iVar5 = std::__cxx11::stoi(local_18,(size_t *)0x0,10);
                bVar3 = iVar5 < 0x100;
              }
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_1a0);
            if (bVar3) {
              std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
              if ((this->_fg & 1U) == 0) {
                Term::ANSI_Escape_Codes::bg_256(&local_1c0,local_18);
              }
              else {
                Term::ANSI_Escape_Codes::fg_256(&local_1c0,local_18);
              }
              std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
              this->_valid = true;
            }
            else {
              local_1c8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&color_fg_abi_cxx11_,local_18);
              local_1d0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&color_fg_abi_cxx11_);
              bVar3 = std::__detail::operator!=(&local_1c8,&local_1d0);
              if (bVar3) {
                std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
                if ((this->_fg & 1U) == 0) {
                  pmVar9 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&color_bg_abi_cxx11_,local_18);
                  std::__cxx11::string::operator=((string *)&this->_value,(string *)pmVar9);
                }
                else {
                  pmVar9 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&color_fg_abi_cxx11_,local_18);
                  std::__cxx11::string::operator=((string *)&this->_value,(string *)pmVar9);
                }
                this->_valid = true;
              }
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&this->_key,(string *)local_18);
            local_139 = 0;
            local_161 = 0;
            if ((this->_fg & 1U) == 0) {
              std::__cxx11::string::string((string *)&local_160,(string *)local_18);
              local_161 = 1;
              Term::ANSI_Escape_Codes::bg_true(&local_118,&local_160);
            }
            else {
              std::__cxx11::string::string((string *)&local_138,(string *)local_18);
              local_139 = 1;
              Term::ANSI_Escape_Codes::fg_true(&local_118,&local_138);
            }
            std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            if ((local_161 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_160);
            }
            if ((local_139 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_138);
            }
            hex_to_hsl(&local_180,this,local_18);
            (this->_hsl).h = local_180.h;
            (this->_hsl).s = local_180.s;
            (this->_hsl).l = local_180.l;
            this->_valid = true;
          }
        }
      }
    }
  }
  return (bool)(this->_valid & 1);
}

Assistant:

bool key(std::string const& k)
  {
    if (! k.empty())
    {
      if (k == "clear")
      {
        // clear
        _key = k;
        _value = "";
        _valid = true;
      }
      else if (k == "reverse")
      {
        // reverse
        _key = k;
        _value = "\x1b[7m";
        _valid = true;
      }
      else if (k == "rainbow" || k == "candy" || k == "party")
      {
        switch(k.at(0))
        {
          case 'r':
          {
            _mode = Mode::rainbow;

            break;
          }

          case 'c':
          {
            _mode = Mode::candy;

            break;
          }

          case 'p':
          {
            _mode = Mode::party;

            break;
          }

          default:
          {
            break;
          }
        }

        _key = k;
        _hsl.h = random(0, 100);
        _value = _fg ? aec::fg_true(hsl_to_hex(_hsl)) :
          aec::bg_true(hsl_to_hex(_hsl));
        _valid = true;
      }
      else
      {
        // 21-bit color
        if (k.at(0) == '#' && OB::String::assert_rx(k,
          std::regex("^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$")))
        {
          _key = k;
          _value = _fg ? aec::fg_true(k) : aec::bg_true(k);
          _hsl = hex_to_hsl(k);
          _valid = true;
        }

        // 8-bit color
        else if (OB::String::assert_rx(k, std::regex("^[0-9]{1,3}$")) &&
          std::stoi(k) >= 0 && std::stoi(k) <= 255)
        {
          _key = k;
          _value = _fg ? aec::fg_256(k) : aec::bg_256(k);
          _valid = true;
        }

        // 4-bit color
        else if (color_fg.find(k) != color_fg.end())
        {
          _key = k;

          if (_fg)
          {
            _value = color_fg.at(k);
          }
          else
          {
            _value = color_bg.at(k);
          }

          _valid = true;
        }
      }
    }

    return _valid;
  }